

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.cpp
# Opt level: O0

void __thiscall FSChaCha20Poly1305::NextPacket(FSChaCha20Poly1305 *this)

{
  Span<const_std::byte> key;
  int iVar1;
  pair<unsigned_int,_unsigned_long> *in_RDI;
  long in_FS_OFFSET;
  byte one_block [64];
  Span<std::byte> *in_stack_ffffffffffffff38;
  Span<std::byte> *this_00;
  uint *in_stack_ffffffffffffff40;
  undefined1 *count;
  pair<unsigned_int,_unsigned_long> *ppVar2;
  pair<unsigned_int,_unsigned_long> *ppVar3;
  Span<std::byte> in_stack_ffffffffffffff60;
  Nonce96 in_stack_ffffffffffffff70;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (int)in_RDI[7].second + 1;
  *(int *)&in_RDI[7].second = iVar1;
  if (iVar1 == *(int *)&in_RDI[7].field_0x4) {
    ppVar2 = in_RDI;
    ppVar3 = in_RDI;
    std::pair<unsigned_int,_unsigned_long>::pair<unsigned_int,_unsigned_long_&,_true>
              (in_RDI,in_stack_ffffffffffffff40,(unsigned_long *)in_stack_ffffffffffffff38);
    count = local_48;
    Span<std::byte>::Span<64>(in_stack_ffffffffffffff38,(byte (*) [64])0x103e01e);
    AEADChaCha20Poly1305::Keystream
              ((AEADChaCha20Poly1305 *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff60);
    this_00 = (Span<std::byte> *)&stack0xffffffffffffff60;
    Span<std::byte>::Span<64>(this_00,(byte (*) [64])0x103e04e);
    Span<std::byte>::first((Span<std::byte> *)in_RDI,(size_t)count);
    Span<const_std::byte>::Span<std::byte,_0>
              ((Span<const_std::byte> *)this_00,(Span<std::byte> *)0x103e075);
    key.m_size = (size_t)ppVar3;
    key.m_data = (byte *)ppVar2;
    AEADChaCha20Poly1305::SetKey((AEADChaCha20Poly1305 *)this_00,key);
    memory_cleanse(this_00,0x103e098);
    *(undefined4 *)&ppVar2[7].second = 0;
    *(undefined8 *)(ppVar2 + 8) = *(undefined8 *)(ppVar2 + 8) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FSChaCha20Poly1305::NextPacket() noexcept
{
    if (++m_packet_counter == m_rekey_interval) {
        // Generate a full block of keystream, to avoid needing the ChaCha20 buffer, even though
        // we only need KEYLEN (32) bytes.
        std::byte one_block[ChaCha20Aligned::BLOCKLEN];
        m_aead.Keystream({0xFFFFFFFF, m_rekey_counter}, one_block);
        // Switch keys.
        m_aead.SetKey(Span{one_block}.first(KEYLEN));
        // Wipe the generated keystream (a copy remains inside m_aead, which will be cleaned up
        // once it cycles again, or is destroyed).
        memory_cleanse(one_block, sizeof(one_block));
        // Update counters.
        m_packet_counter = 0;
        ++m_rekey_counter;
    }
}